

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

int __thiscall QAbstractButtonPrivate::init(QAbstractButtonPrivate *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  QWidget *this_00;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  bool in_stack_00000023;
  WidgetAttribute in_stack_00000024;
  QAbstractButton *q;
  undefined4 in_stack_ffffffffffffffb8;
  FocusPolicy in_stack_ffffffffffffffbc;
  QWidget *this_01;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 policy;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &q_func(this)->super_QWidget;
  this_01 = this_00;
  pQVar2 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x31,0,this_00);
  QWidget::setFocusPolicy(this_01,in_stack_ffffffffffffffbc);
  policy.data = 1;
  QSizePolicy::QSizePolicy
            ((QSizePolicy *)this_00,(Policy)((ulong)this >> 0x20),(Policy)this,
             (ControlType)((ulong)this_01 >> 0x20));
  QWidget::setSizePolicy(this_00,(QSizePolicy)policy);
  QWidget::setAttribute(&q->super_QWidget,in_stack_00000024,in_stack_00000023);
  QWidget::setForegroundRole(this_01,in_stack_ffffffffffffffbc);
  QWidget::setBackgroundRole(this_01,in_stack_ffffffffffffffbc);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButtonPrivate::init()
{
    Q_Q(QAbstractButton);

    q->setFocusPolicy(Qt::FocusPolicy(q->style()->styleHint(QStyle::SH_Button_FocusPolicy, nullptr, q)));
    q->setSizePolicy(QSizePolicy(QSizePolicy::Minimum, QSizePolicy::Fixed, controlType));
    q->setAttribute(Qt::WA_WState_OwnSizePolicy, false);
    q->setForegroundRole(QPalette::ButtonText);
    q->setBackgroundRole(QPalette::Button);
}